

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

void __thiscall ON_SN_BLOCK::Dump(ON_SN_BLOCK *this,ON_TextLog *text_log)

{
  ON_TextLog::Print(text_log,"m_count = %d\n",(ulong)this->m_count);
  ON_TextLog::Print(text_log,"m_purged = %d\n",(ulong)this->m_purged);
  ON_TextLog::Print(text_log,"m_sorted = %d\n",(ulong)this->m_sorted);
  ON_TextLog::Print(text_log,"m_sn0 = %d\n",this->m_sn0);
  ON_TextLog::Print(text_log,"m_sn1 = %d\n",this->m_sn1);
  if (this->m_count != 0) {
    ON_TextLog::Print(text_log,"m_sn[0]\n");
    ON_TextLog::PushIndent(text_log);
    ON_SerialNumberMap::SN_ELEMENT::Dump(this->m_sn,text_log);
    ON_TextLog::PopIndent(text_log);
    if (1 < this->m_count) {
      ON_TextLog::Print(text_log,"m_sn[%d]\n",(ulong)(this->m_count - 1));
      ON_TextLog::PushIndent(text_log);
      ON_SerialNumberMap::SN_ELEMENT::Dump(this->m_sn + (this->m_count - 1),text_log);
      ON_TextLog::PopIndent(text_log);
      return;
    }
  }
  return;
}

Assistant:

void ON_SN_BLOCK::Dump(ON_TextLog& text_log) const
{
  text_log.Print("m_count = %d\n",m_count);
  text_log.Print("m_purged = %d\n",m_purged);
  text_log.Print("m_sorted = %d\n",m_sorted);
  text_log.Print("m_sn0 = %d\n",m_sn0);
  text_log.Print("m_sn1 = %d\n",m_sn1);
  if ( m_count > 0 )
  {
    text_log.Print("m_sn[0]\n");
    text_log.PushIndent();
    m_sn[0].Dump(text_log);
    text_log.PopIndent();
    if ( m_count > 1 )
    {
      text_log.Print("m_sn[%d]\n",m_count-1);
      text_log.PushIndent();
      m_sn[m_count-1].Dump(text_log);
      text_log.PopIndent();
    }
  }
}